

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeSummary_Test::
~TextSerializerTest_shouldSerializeSummary_Test
          (TextSerializerTest_shouldSerializeSummary_Test *this)

{
  TextSerializerTest::~TextSerializerTest(&this->super_TextSerializerTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeSummary) {
  Summary summary{Summary::Quantiles{{0.5, 0.05}}};
  summary.Observe(0);
  summary.Observe(200);
  metric = summary.Collect();

  const auto serialized = Serialize(MetricType::Summary);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 200\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "{quantile=\"0.5\"} 0\n"));
}